

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvs.c
# Opt level: O0

LispPTR values(int arg_count,LispPTR *args)

{
  ushort uVar1;
  LispPTR LVar2;
  FX2 *pFVar3;
  uint local_64;
  uint local_50;
  ushort local_4c;
  int displacement_1;
  short displacement;
  short opcode;
  fnhead *fnhead;
  ByteCode *pBStack_38;
  int unbind_count;
  ByteCode *pc;
  FX2 *immediate_caller;
  FX2 *prevcaller;
  FX2 *caller;
  LispPTR *args_local;
  int arg_count_local;
  
  immediate_caller = (FX2 *)0x0;
  fnhead._4_4_ = 0;
  pFVar3 = (FX2 *)(MachineState.pvar + -10);
  prevcaller = pFVar3;
  do {
    if (prevcaller == pFVar3) {
      _displacement_1 = MachineState.currentfunc;
      pBStack_38 = MachineState.currentpc + 3;
    }
    else {
      _displacement_1 = (fnhead *)NativeAligned4FromLAddr(prevcaller->fnheader & 0xfffffff);
      pBStack_38 = (ByteCode *)((long)&_displacement_1->na + (long)(int)(uint)prevcaller->pc);
    }
LAB_001526ad:
    uVar1 = (ushort)*(byte *)((ulong)pBStack_38 ^ 3);
    if (uVar1 == 9) {
      if (MVLIST_index ==
          ((uint)*(byte *)((ulong)(pBStack_38 + 1) ^ 3) << 0x18 |
           (uint)*(byte *)((ulong)(pBStack_38 + 2) ^ 3) << 0x10 |
           (uint)*(byte *)((ulong)(pBStack_38 + 3) ^ 3) << 8 |
          (uint)*(byte *)((ulong)(pBStack_38 + 4) ^ 3))) {
        if (0 < fnhead._4_4_) {
          simulate_unbind(prevcaller,fnhead._4_4_,immediate_caller);
        }
        if (prevcaller == pFVar3) {
          MachineState.currentpc = pBStack_38 + 2;
        }
        else {
          prevcaller->pc = ((short)pBStack_38 + 5) - (short)_displacement_1;
        }
        LVar2 = make_value_list(arg_count,args);
        return LVar2;
      }
LAB_0015291d:
      if (arg_count < 1) {
        args_local._4_4_ = 0;
      }
      else {
        args_local._4_4_ = *args;
      }
      return args_local._4_4_;
    }
    if (uVar1 == 0x10) goto LAB_00152713;
    if (uVar1 == 0x12) {
      pBStack_38 = pBStack_38 + 1;
      fnhead._4_4_ = fnhead._4_4_ + 1;
      goto LAB_001526ad;
    }
    if (uVar1 != 0x3f) {
      if (uVar1 == 0xb0) {
        local_4c = (ushort)*(byte *)((ulong)(pBStack_38 + 1) ^ 3);
        if (0x7f < local_4c) {
          local_4c = local_4c - 0x100;
        }
        pBStack_38 = pBStack_38 + (int)(short)local_4c;
      }
      else if (uVar1 == 0xb1) {
        local_50 = (uint)CONCAT11(*(undefined1 *)((ulong)(pBStack_38 + 1) ^ 3),
                                  *(undefined1 *)((ulong)(pBStack_38 + 2) ^ 3));
        if (0x7fff < local_50) {
          local_50 = local_50 - 0x10000;
        }
        pBStack_38 = pBStack_38 + (int)local_50;
      }
      else {
        if ((uVar1 < 0x80) || (0x8f < uVar1)) goto LAB_0015291d;
        pBStack_38 = pBStack_38 + ((short)uVar1 + -0x7e);
      }
      goto LAB_001526ad;
    }
LAB_00152713:
    immediate_caller = prevcaller;
    if (((undefined1  [20])*prevcaller & (undefined1  [20])0x1) == (undefined1  [20])0x0) {
      uVar1 = prevcaller->alink;
    }
    else {
      uVar1 = prevcaller->clink;
    }
    local_64 = uVar1 - 10;
    prevcaller = (FX2 *)(Stackspace + local_64);
  } while( true );
}

Assistant:

LispPTR values(int arg_count, LispPTR *args) {
  FX2 *caller, *prevcaller = 0, *immediate_caller = 0;
  ByteCode *pc;
  int unbind_count = 0;
  struct fnhead *fnhead;
  short opcode;

  caller = (FX2 *)CURRENTFX;
  immediate_caller = caller;

newframe:
  if (caller == immediate_caller) {
    fnhead = (struct fnhead *)FuncObj;
    pc = (ByteCode *)PC + 3; /* to skip the miscn opcode we're in now */
  } else {
    fnhead = (struct fnhead *)NativeAligned4FromLAddr(POINTERMASK & SWA_FNHEAD((int)caller->fnheader));
    pc = (ByteCode *)fnhead + (caller->pc);
  }
#ifdef RESWAPPEDCODESTREAM
  if (!fnhead->byteswapped) {
    byte_swap_code_block(fnhead);
    fnhead->byteswapped = 1;
  }
#endif /* RESWAPPEDCODESTREAM */

newpc:
  opcode = (short)((unsigned char)GETBYTE((char *)pc));
  switch (opcode) {
    case opc_RETURN:
    case opc_SLRETURN:
      prevcaller = caller;
      caller = (FX2 *)(Stackspace + (unsigned)(GETCLINK(caller)));
      goto newframe;

    case opc_FN1:
      if (MVLIST_index == Get_code_AtomNo(pc + 1)) {
        if (unbind_count > 0) simulate_unbind(caller, unbind_count, prevcaller);
#ifndef BIGATOMS
        /* would add 3 to  PC, but miscn return code does.*/
        if (caller == immediate_caller) PC = pc;
#else
        /* BUT 3's not enough for big atoms, so add diff between FN op size & MISCN op size */
        if (caller == immediate_caller) PC = pc + (FN_OPCODE_SIZE - 3);
#endif /* BIGATOMS */

        else
          caller->pc = (UNSIGNED)pc + FN_OPCODE_SIZE - (UNSIGNED)fnhead;
        return (make_value_list(arg_count, args));
      }
      break;

    case opc_UNBIND:
      pc += 1;
      unbind_count += 1;
      goto newpc;

    case opc_JUMPX: {
      short displacement;
      displacement = (short)(GETBYTE((char *)pc + 1));
      if (displacement >= 128) displacement -= 256;
      pc += displacement;
      goto newpc;
    }

    case opc_JUMPXX: {
      int displacement;
      displacement = (int)Get_code_DLword(pc + 1);
      if (displacement >= 32768) displacement -= 65536;
      pc += displacement;
      goto newpc;
    }
    default:
      if ((opcode >= opc_JUMP) && (opcode < opc_FJUMP)) {
        pc += 2 + opcode - opc_JUMP;
        goto newpc;
      }
  }

  /*****************************************/
  /* Default case:  Return a single value. */
  /*****************************************/

  if (arg_count > 0)
    return (args[0]);
  else
    return (NIL_PTR);
}